

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O2

void __thiscall
JtagAnalyzerResults::GenerateExportFile
          (JtagAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  undefined2 uVar1;
  char cVar2;
  uint uVar3;
  ulonglong uVar4;
  ostream *poVar5;
  ulonglong uVar6;
  iterator iVar7;
  ulonglong uVar8;
  char *pcVar9;
  string *psVar10;
  TdiTdoStringFormat format;
  string tdo_str;
  string tdi_str;
  Frame frm;
  byte local_368;
  string tdo_count_str;
  string tdi_count_str;
  JtagShiftedData sd;
  string local_2e0;
  undefined2 local_2c0;
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar4 = Analyzer::GetTriggerSample();
  uVar3 = Analyzer::GetSampleRate();
  pcVar9 = "Time [s];TAP state;TDI;TDO";
  if (this->mSettings->mShowBitCount != false) {
    pcVar9 = "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount";
  }
  poVar5 = std::operator<<((ostream *)&file_stream,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar5);
  Frame::Frame(&frm);
  tdi_str._M_dataplus._M_p = (pointer)&tdi_str.field_2;
  tdi_str._M_string_length = 0;
  tdi_str.field_2._M_local_buf[0] = '\0';
  tdo_str._M_dataplus._M_p = (pointer)&tdo_str.field_2;
  tdo_str._M_string_length = 0;
  sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sd.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tdo_str.field_2._M_local_buf[0] = '\0';
  tdi_count_str._M_dataplus._M_p = (pointer)&tdi_count_str.field_2;
  tdi_count_str._M_string_length = 0;
  sd.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sd.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tdi_count_str.field_2._M_local_buf[0] = '\0';
  tdo_count_str._M_dataplus._M_p = (pointer)&tdo_count_str.field_2;
  tdo_count_str._M_string_length = 0;
  tdo_count_str.field_2._M_local_buf[0] = '\0';
  uVar6 = AnalyzerResults::GetNumFrames();
  uVar8 = 0;
  do {
    if (uVar6 == uVar8) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar6);
      break;
    }
    AnalyzerResults::GetFrame((ulonglong)&local_2e0);
    uVar1 = local_2c0;
    _frm = local_2e0._M_dataplus._M_p;
    Frame::~Frame((Frame *)&local_2e0);
    format = 0x80;
    AnalyzerHelpers::GetTimeString((ulonglong)_frm,uVar4,uVar3,time_str,0x80);
    local_368 = (byte)uVar1;
    tdi_str._M_string_length = 0;
    *tdi_str._M_dataplus._M_p = '\0';
    tdo_str._M_string_length = 0;
    *tdo_str._M_dataplus._M_p = '\0';
    tdi_count_str._M_string_length = 0;
    *tdi_count_str._M_dataplus._M_p = '\0';
    tdo_count_str._M_string_length = 0;
    *tdo_count_str._M_dataplus._M_p = '\0';
    if ((local_368 == 0xb) || (local_368 == 4)) {
      sd.mStartSampleIndex = (U64)_frm;
      iVar7 = std::
              _Rb_tree<JtagShiftedData,_JtagShiftedData,_std::_Identity<JtagShiftedData>,_std::less<JtagShiftedData>,_std::allocator<JtagShiftedData>_>
              ::find(&(this->mShiftedData)._M_t,&sd);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(this->mShiftedData)._M_t._M_impl.super__Rb_tree_header) {
        JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                  (&local_2e0,(JtagShiftedData *)&iVar7._M_node[1]._M_parent,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)display_base,
                   Decimal,format);
        std::__cxx11::string::operator=((string *)&tdi_str,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                  (&local_2e0,(JtagShiftedData *)(iVar7._M_node + 2),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)display_base,
                   Decimal,format);
        std::__cxx11::string::operator=((string *)&tdo_str,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        if (this->mSettings->mShowBitCount == true) {
          JtagShiftedData::GetTDILengthString_abi_cxx11_
                    (&local_2e0,(JtagShiftedData *)(iVar7._M_node + 1),false);
          std::__cxx11::string::operator=((string *)&tdi_count_str,(string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
          JtagShiftedData::GetTDOLengthString_abi_cxx11_
                    (&local_2e0,(JtagShiftedData *)(iVar7._M_node + 1),false);
          std::__cxx11::string::operator=((string *)&tdo_count_str,(string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
      }
    }
    if (this->mSettings->mShowBitCount == true) {
      poVar5 = std::operator<<((ostream *)&file_stream,time_str);
      poVar5 = std::operator<<(poVar5,";");
      pcVar9 = "<undefined>";
      if (local_368 < 0x10) {
        pcVar9 = TAPStateDescLong[local_368];
      }
      poVar5 = std::operator<<(poVar5,pcVar9);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&tdi_str);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&tdo_str);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&tdi_count_str);
      poVar5 = std::operator<<(poVar5,";");
      psVar10 = &tdo_count_str;
    }
    else {
      poVar5 = std::operator<<((ostream *)&file_stream,time_str);
      poVar5 = std::operator<<(poVar5,";");
      pcVar9 = "<undefined>";
      if (local_368 < 0x10) {
        pcVar9 = TAPStateDescLong[local_368];
      }
      poVar5 = std::operator<<(poVar5,pcVar9);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&tdi_str);
      poVar5 = std::operator<<(poVar5,";");
      psVar10 = &tdo_str;
    }
    poVar5 = std::operator<<(poVar5,(string *)psVar10);
    std::endl<char,std::char_traits<char>>(poVar5);
    cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
    uVar8 = uVar8 + 1;
  } while (cVar2 == '\0');
  std::__cxx11::string::~string((string *)&tdo_count_str);
  std::__cxx11::string::~string((string *)&tdi_count_str);
  std::__cxx11::string::~string((string *)&tdo_str);
  std::__cxx11::string::~string((string *)&tdi_str);
  JtagShiftedData::~JtagShiftedData(&sd);
  Frame::~Frame(&frm);
  std::ofstream::~ofstream(&file_stream);
  return;
}

Assistant:

void JtagAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( mSettings->mShowBitCount )
        file_stream << "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount" << std::endl;
    else
        file_stream << "Time [s];TAP state;TDI;TDO" << std::endl;

    Frame frm;
    JtagShiftedData sd;
    std::set<JtagShiftedData>::iterator sdi;
    char time_str[ 128 ];
    std::string tdi_str, tdo_str, tdi_count_str, tdo_count_str;
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        frm = GetFrame( fcnt );

        // make the time string
        AnalyzerHelpers::GetTimeString( frm.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // get the TAP state
        JtagTAPState tap_state = ( JtagTAPState )frm.mType;

        // make the TDI/TDO data if we're in a shift state
        tdi_str.clear();
        tdo_str.clear();
        tdi_count_str.clear();
        tdo_count_str.clear();
        if( tap_state == ShiftIR || tap_state == ShiftDR )
        {
            // find TDI/TDO data
            sd.mStartSampleIndex = frm.mStartingSampleInclusive;
            sdi = mShiftedData.find( sd );

            // found?
            if( sdi != mShiftedData.end() )
            {
                tdi_str = sdi->GetTDIString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );
                tdo_str = sdi->GetTDOString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );

                if( mSettings->mShowBitCount )
                {
                    tdi_count_str = sdi->GetTDILengthString( false );
                    tdo_count_str = sdi->GetTDOLengthString( false );
                }
            }
        }

        // output
        if( mSettings->mShowBitCount )
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << ";" << tdi_count_str
                        << ";" << tdo_count_str << std::endl;
        else
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << std::endl;

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}